

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzhyperplane.cpp
# Opt level: O1

REAL __thiscall
TPZHyperPlaneIntersect::EdgeIntersect
          (TPZHyperPlaneIntersect *this,TPZGeoElSide *gelside,TPZHyperPlane *plane)

{
  double dVar1;
  long lVar2;
  uint uVar3;
  pointer_____offset_0x18___ *vtt;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  ulong uVar7;
  long lVar8;
  int i_1;
  uint uVar9;
  long lVar10;
  REAL distance;
  TPZManVector<double,_1> edgeparam;
  REAL detjac;
  TPZFNMatrix<1,_double> jacinv;
  TPZManVector<double,_3> X;
  TPZFNMatrix<3,_double> axes;
  TPZManVector<double,_3> planejac;
  TPZFNMatrix<1,_double> edgejac;
  double local_350;
  TPZVec<double> local_348;
  double dStack_328;
  pointer_____offset_0x18___ *local_320;
  TPZGeoElSide *local_318;
  undefined **local_310;
  pointer_____offset_0x18___ *local_308;
  TPZHyperPlane *local_300;
  double local_2f8;
  undefined8 uStack_2f0;
  _func_int **local_2e0;
  _func_int **local_2d8;
  _func_int **local_2d0;
  double *local_2c8;
  _func_int **local_2c0;
  _func_int **local_2b8;
  double *local_2b0;
  double *local_2a8;
  ulong local_2a0;
  REAL local_298;
  TPZFMatrix<double> local_290;
  double local_200 [2];
  TPZManVector<double,_3> local_1f0;
  TPZFMatrix<double> local_1b8;
  double local_128 [4];
  TPZManVector<double,_3> local_108;
  TPZFMatrix<double> local_d0;
  double local_40 [2];
  
  local_318 = gelside;
  local_300 = plane;
  TPZVec<double>::TPZVec(&local_348,0);
  local_310 = &PTR__TPZManVector_018df490;
  local_348._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018df490;
  local_348.fStore = &dStack_328;
  local_348.fNElements = 1;
  local_348.fNAlloc = 0;
  dStack_328 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&local_108,3);
  TPZManVector<double,_3>::TPZManVector(&local_1f0,3);
  TPZGeoElSide::X(local_318,&local_348,&local_1f0.super_TPZVec<double>);
  lVar10 = *(long *)(local_300 + 8);
  lVar2 = *(long *)(local_300 + 0x40);
  local_2f8 = 0.0;
  lVar8 = 0;
  do {
    dVar1 = *(double *)(lVar2 + lVar8 * 8);
    local_2f8 = local_2f8 +
                (local_1f0.super_TPZVec<double>.fStore[lVar8] - *(double *)(lVar10 + lVar8 * 8)) *
                dVar1;
    local_108.super_TPZVec<double>.fStore[lVar8] = dVar1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  uStack_2f0 = 0;
  if (1e-06 < ABS(local_2f8)) {
    local_2a8 = local_40;
    local_2b0 = local_200;
    local_2c8 = local_128;
    local_2b8 = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_2d0 = (_func_int **)&PTR__TPZFMatrix_0186ce28;
    local_2d8 = (_func_int **)&PTR__TPZFNMatrix_0186cb38;
    local_308 = &PTR_PTR_0186cdf0;
    local_320 = &PTR_PTR_018e21b0;
    uVar7 = 0;
    local_2e0 = (_func_int **)&PTR__TPZFMatrix_018e21e8;
    local_2c0 = (_func_int **)&PTR__TPZFNMatrix_018e1ef8;
    do {
      pp_Var4 = local_2e0;
      local_d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
      local_d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_d0.fElem = local_2a8;
      local_d0.fGiven = local_2a8;
      local_d0.fSize = 1;
      local_2a0 = uVar7;
      local_d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_2e0;
      TPZVec<int>::TPZVec(&local_d0.fPivot.super_TPZVec<int>,0);
      pp_Var6 = local_2b8;
      pp_Var5 = local_2c0;
      local_d0.fPivot.super_TPZVec<int>._vptr_TPZVec = local_2b8;
      local_d0.fPivot.super_TPZVec<int>.fStore = local_d0.fPivot.fExtAlloc;
      local_d0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_d0.fWork.fStore = (double *)0x0;
      local_d0.fWork.fNElements = 0;
      local_d0.fWork.fNAlloc = 0;
      local_d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_2c0;
      local_290.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
      local_290.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_290.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_290.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_290.fElem = local_2b0;
      local_290.fGiven = local_2b0;
      local_290.fSize = 1;
      local_290.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           pp_Var4;
      TPZVec<int>::TPZVec(&local_290.fPivot.super_TPZVec<int>,0);
      local_290.fPivot.super_TPZVec<int>._vptr_TPZVec = pp_Var6;
      local_290.fPivot.super_TPZVec<int>.fStore = local_290.fPivot.fExtAlloc;
      local_290.fPivot.super_TPZVec<int>.fNElements = 0;
      local_290.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_290.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_290.fWork.fStore = (double *)0x0;
      local_290.fWork.fNElements = 0;
      local_290.fWork.fNAlloc = 0;
      local_290.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           pp_Var5;
      local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
      local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
      local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_2d0;
      local_1b8.fElem = local_2c8;
      local_1b8.fGiven = local_2c8;
      local_1b8.fSize = 3;
      TPZVec<int>::TPZVec(&local_1b8.fPivot.super_TPZVec<int>,0);
      local_1b8.fPivot.super_TPZVec<int>._vptr_TPZVec = pp_Var6;
      local_1b8.fPivot.super_TPZVec<int>.fStore = local_1b8.fPivot.fExtAlloc;
      local_1b8.fPivot.super_TPZVec<int>.fNElements = 0;
      local_1b8.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_1b8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_1b8.fWork.fStore = (double *)0x0;
      local_1b8.fWork.fNElements = 0;
      local_1b8.fWork.fNAlloc = 0;
      local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_2d8;
      TPZGeoElSide::Jacobian(local_318,&local_348,&local_d0,&local_1b8,&local_298,&local_290);
      local_350 = 0.0;
      lVar10 = 0;
      do {
        if ((local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
           (local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar10)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_350 = local_350 +
                    local_1b8.fElem
                    [local_1b8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar10] *
                    local_108.super_TPZVec<double>.fStore[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      if ((local_290.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
         (local_290.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      *local_348.fStore = *local_348.fStore - (local_2f8 * *local_290.fElem) / local_350;
      TPZGeoElSide::X(local_318,&local_348,&local_1f0.super_TPZVec<double>);
      lVar10 = *(long *)(local_300 + 8);
      lVar2 = *(long *)(local_300 + 0x40);
      local_2f8 = 0.0;
      lVar8 = 0;
      do {
        dVar1 = *(double *)(lVar2 + lVar8 * 8);
        local_2f8 = local_2f8 +
                    (local_1f0.super_TPZVec<double>.fStore[lVar8] - *(double *)(lVar10 + lVar8 * 8))
                    * dVar1;
        local_108.super_TPZVec<double>.fStore[lVar8] = dVar1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      uVar3 = (uint)local_2a0;
      uVar9 = uVar3 + 1;
      uStack_2f0 = 0;
      TPZFMatrix<double>::~TPZFMatrix(&local_1b8,local_308);
      vtt = local_320;
      TPZFMatrix<double>::~TPZFMatrix(&local_290,local_320);
      TPZFMatrix<double>::~TPZFMatrix(&local_d0,vtt);
    } while ((1e-06 < ABS(local_2f8)) && (uVar7 = (ulong)uVar9, uVar3 < 4));
    if (uVar9 == 5) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzhyperplane.cpp"
                 ,0xec);
    }
  }
  dVar1 = *local_348.fStore;
  TPZManVector<double,_3>::~TPZManVector(&local_1f0);
  TPZManVector<double,_3>::~TPZManVector(&local_108);
  if (local_348.fStore == &dStack_328) {
    local_348.fStore = (double *)0x0;
  }
  local_348.fNAlloc = 0;
  local_348._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_348.fStore != (double *)0x0) {
    operator_delete__(local_348.fStore);
  }
  return dVar1;
}

Assistant:

REAL TPZHyperPlaneIntersect::EdgeIntersect(const TPZGeoElSide &gelside, const TPZHyperPlane &plane)
{
    TPZManVector<REAL, 1> edgeparam(1,0.);
    TPZManVector<REAL,3> planejac(3), X(3);
    gelside.X(edgeparam, X);
    REAL distance = plane.Distance(X,planejac);
    int niter = 0;
    while (std::abs(distance) > 1.e-6 && niter < 5) {
        TPZFNMatrix<1,REAL> edgejac(1,1), jacinv(1,1);
        TPZFNMatrix<3,REAL> axes(1,3);
        REAL detjac;
        gelside.Jacobian(edgeparam,edgejac, axes, detjac, jacinv);
        REAL inner = 0;
        for (int i=0; i<3; i++) {
            inner += axes(0,i)*planejac[i];
        }
        edgeparam[0] -= jacinv(0,0)*distance/inner;
        gelside.X(edgeparam, X);
        distance = plane.Distance(X, planejac);
        niter++;
    }
    if (niter == 5) {
        DebugStop();
    }
    return edgeparam[0];
}